

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::Shader>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Shader *shader,string *prop_name,Property *out_prop)

{
  ParseState *value;
  Property *in_R8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  UsdPreviewSurface *local_68;
  UsdPreviewSurface *psurf;
  UsdUVTexture *ptex;
  UsdTransform2d *ptx2d;
  UsdPrimvarReader<std::array<float,_4UL>_> *preader_f4;
  UsdPrimvarReader<std::array<float,_3UL>_> *preader_f3;
  UsdPrimvarReader<std::array<float,_2UL>_> *preader_f2;
  UsdPrimvarReader<float> *preader_f;
  Property *local_28;
  Property *out_prop_local;
  string *prop_name_local;
  Shader *shader_local;
  
  local_28 = out_prop;
  out_prop_local = (Property *)prop_name;
  prop_name_local = (string *)shader;
  shader_local = (Shader *)__return_storage_ptr__;
  if (out_prop == (Property *)0x0) {
    preader_f = (UsdPrimvarReader<float> *)
                nonstd::expected_lite::make_unexpected<char_const(&)[59]>
                          ((char (*) [59])
                           "[InternalError] nullptr in output Property is not allowed.");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&preader_f);
  }
  else {
    preader_f2 = (UsdPrimvarReader<std::array<float,_2UL>_> *)
                 tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<float>>(&shader->value,false)
    ;
    if (preader_f2 == (UsdPrimvarReader<std::array<float,_2UL>_> *)0x0) {
      preader_f3 = (UsdPrimvarReader<std::array<float,_3UL>_> *)
                   tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                             ((Value *)&prop_name_local[0x3a].field_2,false);
      if (preader_f3 == (UsdPrimvarReader<std::array<float,_3UL>_> *)0x0) {
        preader_f4 = (UsdPrimvarReader<std::array<float,_4UL>_> *)
                     tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                               ((Value *)&prop_name_local[0x3a].field_2,false);
        if (preader_f4 == (UsdPrimvarReader<std::array<float,_4UL>_> *)0x0) {
          ptx2d = (UsdTransform2d *)
                  tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                            ((Value *)&prop_name_local[0x3a].field_2,false);
          if (ptx2d == (UsdTransform2d *)0x0) {
            ptex = (UsdUVTexture *)
                   tinyusdz::value::Value::as<tinyusdz::UsdTransform2d>
                             ((Value *)&prop_name_local[0x3a].field_2,false);
            if (ptex == (UsdUVTexture *)0x0) {
              psurf = (UsdPreviewSurface *)
                      tinyusdz::value::Value::as<tinyusdz::UsdUVTexture>
                                ((Value *)&prop_name_local[0x3a].field_2,false);
              if (psurf == (UsdPreviewSurface *)0x0) {
                local_68 = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>
                                     ((Value *)&prop_name_local[0x3a].field_2,false);
                if (local_68 == (UsdPreviewSurface *)0x0) {
                  tinyusdz::value::Value::type_name_abi_cxx11_
                            (&local_c8,(Value *)&prop_name_local[0x3a].field_2);
                  ::std::operator+(&local_a8,"TODO: ",&local_c8);
                  nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                            (&local_88,(expected_lite *)&local_a8,value);
                  nonstd::expected_lite::
                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (__return_storage_ptr__,&local_88);
                  nonstd::expected_lite::
                  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~unexpected_type(&local_88);
                  ::std::__cxx11::string::~string((string *)&local_a8);
                  ::std::__cxx11::string::~string((string *)&local_c8);
                }
                else {
                  GetPrimProperty<tinyusdz::UsdPreviewSurface>
                            (__return_storage_ptr__,local_68,(string *)out_prop_local,local_28);
                }
              }
              else {
                GetPrimProperty<tinyusdz::UsdUVTexture>
                          (__return_storage_ptr__,(UsdUVTexture *)psurf,(string *)out_prop_local,
                           local_28);
              }
            }
            else {
              GetPrimProperty<tinyusdz::UsdTransform2d>
                        (__return_storage_ptr__,(UsdTransform2d *)ptex,(string *)out_prop_local,
                         local_28);
            }
          }
          else {
            (anonymous_namespace)::
            GetPrimProperty<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                      (__return_storage_ptr__,(_anonymous_namespace_ *)ptx2d,
                       (UsdPrimvarReader_float4 *)out_prop_local,(string *)local_28,in_R8);
          }
        }
        else {
          (anonymous_namespace)::GetPrimProperty<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                    (__return_storage_ptr__,(_anonymous_namespace_ *)preader_f4,
                     (UsdPrimvarReader_float3 *)out_prop_local,(string *)local_28,in_R8);
        }
      }
      else {
        (anonymous_namespace)::GetPrimProperty<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                  (__return_storage_ptr__,(_anonymous_namespace_ *)preader_f3,
                   (UsdPrimvarReader_float2 *)out_prop_local,(string *)local_28,in_R8);
      }
    }
    else {
      (anonymous_namespace)::GetPrimProperty<tinyusdz::UsdPrimvarReader<float>>
                (__return_storage_ptr__,(_anonymous_namespace_ *)preader_f2,
                 (UsdPrimvarReader_float *)out_prop_local,(string *)local_28,in_R8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const Shader &shader, const std::string &prop_name, Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  if (const auto preader_f = shader.value.as<UsdPrimvarReader_float>()) {
    return GetPrimProperty(*preader_f, prop_name, out_prop);
  } else if (const auto preader_f2 =
                 shader.value.as<UsdPrimvarReader_float2>()) {
    return GetPrimProperty(*preader_f2, prop_name, out_prop);
  } else if (const auto preader_f3 =
                 shader.value.as<UsdPrimvarReader_float3>()) {
    return GetPrimProperty(*preader_f3, prop_name, out_prop);
  } else if (const auto preader_f4 =
                 shader.value.as<UsdPrimvarReader_float4>()) {
    return GetPrimProperty(*preader_f4, prop_name, out_prop);
  } else if (const auto ptx2d = shader.value.as<UsdTransform2d>()) {
    return GetPrimProperty(*ptx2d, prop_name, out_prop);
  } else if (const auto ptex = shader.value.as<UsdUVTexture>()) {
    return GetPrimProperty(*ptex, prop_name, out_prop);
  } else if (const auto psurf = shader.value.as<UsdPreviewSurface>()) {
    return GetPrimProperty(*psurf, prop_name, out_prop);
  } else {
    return nonstd::make_unexpected("TODO: " + shader.value.type_name());
  }
}